

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

bool __thiscall cmWorkerPool::Process(cmWorkerPool *this,void *userData)

{
  bool bVar1;
  pointer this_00;
  bool success;
  void *userData_local;
  cmWorkerPool *this_local;
  
  this->UserData_ = userData;
  this_00 = std::unique_ptr<cmWorkerPoolInternal,_std::default_delete<cmWorkerPoolInternal>_>::
            operator->(&this->Int_);
  bVar1 = cmWorkerPoolInternal::Process(this_00);
  this->UserData_ = (void *)0x0;
  return bVar1;
}

Assistant:

bool cmWorkerPool::Process(void* userData)
{
  // Setup user data
  UserData_ = userData;
  // Run libuv loop
  bool success = Int_->Process();
  // Clear user data
  UserData_ = nullptr;
  // Return
  return success;
}